

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

int __thiscall
re2::Compiler::CachedRuneByteSuffix(Compiler *this,uint8_t lo,uint8_t hi,bool foldcase,int next)

{
  bool bVar1;
  int iVar2;
  _Node_iterator_base<std::pair<const_unsigned_long,_int>,_false> this_00;
  _Node_iterator_base<std::pair<const_unsigned_long,_int>,_false> _Var3;
  pointer pvVar4;
  mapped_type *pmVar5;
  byte in_CL;
  uint8_t in_DL;
  uint8_t in_SIL;
  int in_R8D;
  int id;
  const_iterator it;
  uint64_t key;
  unordered_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
  *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar6;
  _Node_iterator_base<std::pair<const_unsigned_long,_int>,_false> local_28;
  uint64_t local_20;
  undefined1 local_13;
  int local_4;
  
  local_13 = in_CL & 1;
  local_20 = MakeRuneCacheKey(in_SIL,in_DL,(bool)local_13,in_R8D);
  this_00._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
       ::find(in_stack_ffffffffffffffa8,(key_type *)0x21c297);
  std::__detail::_Node_const_iterator<std::pair<const_unsigned_long,_int>,_false,_false>::
  _Node_const_iterator
            ((_Node_const_iterator<std::pair<const_unsigned_long,_int>,_false,_false> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (_Node_iterator<std::pair<const_unsigned_long,_int>,_false,_false> *)
             in_stack_ffffffffffffffa8);
  _Var3._M_cur = (__node_type *)
                 std::
                 unordered_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                 ::end(in_stack_ffffffffffffffa8);
  bVar1 = std::__detail::operator!=
                    (&local_28,
                     (_Node_iterator_base<std::pair<const_unsigned_long,_int>,_false> *)
                     &stack0xffffffffffffffc8);
  if (bVar1) {
    pvVar4 = std::__detail::_Node_const_iterator<std::pair<const_unsigned_long,_int>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_unsigned_long,_int>,_false,_false> *
                          )0x21c2dd);
    local_4 = pvVar4->second;
  }
  else {
    iVar2 = UncachedRuneByteSuffix
                      ((Compiler *)this_00._M_cur,(uint8_t)((ulong)_Var3._M_cur >> 0x38),
                       (uint8_t)((ulong)_Var3._M_cur >> 0x30),SUB81((ulong)_Var3._M_cur >> 0x28,0),
                       (int)_Var3._M_cur);
    iVar6 = iVar2;
    pmVar5 = std::
             unordered_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
             ::operator[]((unordered_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                           *)CONCAT44(iVar2,in_stack_ffffffffffffffb0),
                          (key_type *)in_stack_ffffffffffffffa8);
    *pmVar5 = iVar6;
    local_4 = iVar2;
  }
  return local_4;
}

Assistant:

int Compiler::CachedRuneByteSuffix(uint8_t lo, uint8_t hi, bool foldcase,
                                   int next) {
  uint64_t key = MakeRuneCacheKey(lo, hi, foldcase, next);
  std::unordered_map<uint64_t, int>::const_iterator it = rune_cache_.find(key);
  if (it != rune_cache_.end())
    return it->second;
  int id = UncachedRuneByteSuffix(lo, hi, foldcase, next);
  rune_cache_[key] = id;
  return id;
}